

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_unix.cpp
# Opt level: O0

void __thiscall QSystemLocaleData::QSystemLocaleData(QSystemLocaleData *this)

{
  QSystemLocaleData *in_RDI;
  Territory in_stack_ffffffffffffff8a;
  Script in_stack_ffffffffffffff8c;
  Language in_stack_ffffffffffffff8e;
  QLocale *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  QReadWriteLock *in_stack_ffffffffffffffa0;
  
  QReadWriteLock::QReadWriteLock
            (in_stack_ffffffffffffffa0,(RecursionMode)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  QLocale::QLocale(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c,
                   in_stack_ffffffffffffff8a);
  QLocale::QLocale(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c,
                   in_stack_ffffffffffffff8a);
  QLocale::QLocale(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c,
                   in_stack_ffffffffffffff8a);
  QLocale::QLocale(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c,
                   in_stack_ffffffffffffff8a);
  QByteArray::QByteArray((QByteArray *)0x72aa87);
  QByteArray::QByteArray((QByteArray *)0x72aa9a);
  QByteArray::QByteArray((QByteArray *)0x72aaad);
  QList<QString>::QList((QList<QString> *)0x72aac0);
  readEnvironment(in_RDI);
  return;
}

Assistant:

QSystemLocaleData()
        : lc_numeric(QLocale::C)
         ,lc_time(QLocale::C)
         ,lc_monetary(QLocale::C)
         ,lc_messages(QLocale::C)
    {
        readEnvironment();
    }